

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_significand<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,fmt::v8::detail::digit_grouping<char8_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,unsigned_long significand,
          int significand_size,int exponent,digit_grouping<char8_t> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar1;
  format_decimal_result<char_*> fVar2;
  format_decimal_result<char8_t_*> fVar3;
  char buffer_2 [20];
  memory_buffer buffer;
  char local_258 [32];
  undefined **local_238;
  char *local_230;
  size_t local_228;
  ulong local_220;
  char local_218 [504];
  
  if ((grouping->sep_).thousands_sep == '\0') {
    fVar3 = format_decimal<char8_t,unsigned_long>
                      ((char8_t *)&local_238,significand,significand_size);
    bVar1 = copy_str_noinline<char8_t,char8_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                      ((char8_t *)&local_238,fVar3.end,out);
    local_238 = (undefined **)CONCAT71(local_238._1_7_,0x30);
    bVar1 = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,char8_t>
                      (bVar1,exponent,(char8_t *)&local_238);
  }
  else {
    local_228 = 0;
    local_238 = &PTR_grow_001b3930;
    local_220 = 500;
    local_230 = local_218;
    fVar2 = format_decimal<char,unsigned_long>(local_258,significand,significand_size);
    copy_str_noinline<char,char*,fmt::v8::appender>(local_258,fVar2.end,(appender)&local_238);
    local_258[0] = '0';
    fill_n<fmt::v8::appender,int,char>((appender)&local_238,exponent,local_258);
    digits.size_ = local_228;
    digits.data_ = local_230;
    bVar1 = digit_grouping<char8_t>::
            apply<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char>
                      (grouping,out,digits);
    if (local_230 != local_218) {
      operator_delete(local_230,local_220);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}